

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_export.cpp
# Opt level: O2

void __thiscall
duckdb::ExportAggregateBindData::ExportAggregateBindData
          (ExportAggregateBindData *this,AggregateFunction *aggr_p,idx_t state_size_p)

{
  (this->super_FunctionData)._vptr_FunctionData =
       (_func_int **)&PTR__ExportAggregateBindData_01796c88;
  AggregateFunction::AggregateFunction(&this->aggr,aggr_p);
  this->state_size = state_size_p;
  return;
}

Assistant:

explicit ExportAggregateBindData(AggregateFunction aggr_p, idx_t state_size_p)
	    : aggr(std::move(aggr_p)), state_size(state_size_p) {
	}